

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace_desc_array_access_using_var_index.cpp
# Opt level: O2

void __thiscall
spvtools::opt::ReplaceDescArrayAccessUsingVarIndex::CollectRecursiveUsersWithConcreteType
          (ReplaceDescArrayAccessUsingVarIndex *this,Instruction *access_chain,
          vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          *final_users)

{
  Instruction *def;
  DefUseManager *this_00;
  _Any_data local_a8;
  code *local_98;
  code *local_90;
  Instruction *access_chain_local;
  queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
  work_list;
  
  access_chain_local = access_chain;
  std::
  queue<spvtools::opt::Instruction*,std::deque<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>>
  ::queue<std::deque<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>,void>
            (&work_list);
  std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::push_back
            (&work_list.c,&access_chain_local);
  while (work_list.c.
         super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
         work_list.c.
         super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
         ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    def = *work_list.c.
           super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
    std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
    pop_front(&work_list.c);
    this_00 = Pass::get_def_use_mgr(&this->super_Pass);
    local_a8._8_8_ = 0;
    local_a8._M_unused._M_object = ::operator_new(0x18);
    *(ReplaceDescArrayAccessUsingVarIndex **)local_a8._M_unused._0_8_ = this;
    *(vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> **)
     ((long)local_a8._M_unused._0_8_ + 8) = final_users;
    *(queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
      **)((long)local_a8._M_unused._0_8_ + 0x10) = &work_list;
    local_90 = std::
               _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/replace_desc_array_access_using_var_index.cpp:111:30)>
               ::_M_invoke;
    local_98 = std::
               _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/replace_desc_array_access_using_var_index.cpp:111:30)>
               ::_M_manager;
    analysis::DefUseManager::ForEachUser
              (this_00,def,(function<void_(spvtools::opt::Instruction_*)> *)&local_a8);
    if (local_98 != (code *)0x0) {
      (*local_98)(&local_a8,&local_a8,__destroy_functor);
    }
  }
  std::_Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  ~_Deque_base((_Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                *)&work_list);
  return;
}

Assistant:

void ReplaceDescArrayAccessUsingVarIndex::CollectRecursiveUsersWithConcreteType(
    Instruction* access_chain, std::vector<Instruction*>* final_users) const {
  std::queue<Instruction*> work_list;
  work_list.push(access_chain);
  while (!work_list.empty()) {
    auto* inst_from_work_list = work_list.front();
    work_list.pop();
    get_def_use_mgr()->ForEachUser(
        inst_from_work_list, [this, final_users, &work_list](Instruction* use) {
          // TODO: Support Boolean type as well.
          if (!use->HasResultId() || IsConcreteType(use->type_id())) {
            final_users->push_back(use);
          } else {
            work_list.push(use);
          }
        });
  }
}